

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

BVStatic<256UL> * __thiscall
Memory::HeapBlockMap64::GetMarkBitVectorForPages<256ul>(HeapBlockMap64 *this,void *address)

{
  L2MapChunk *this_00;
  Node *extraout_RAX;
  Node *pNVar1;
  BVStatic<256UL> *pBVar2;
  
  for (pNVar1 = this->list; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
    if (pNVar1->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_006b7ef1;
  }
  GetMarkBitVectorForPages<256ul>();
  pNVar1 = extraout_RAX;
LAB_006b7ef1:
  this_00 = (pNVar1->map).map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 != (L2MapChunk *)0x0) {
    pBVar2 = BVStatic<65536ul>::GetRange<256ul>
                       ((BVStatic<65536ul> *)this_00,(uint)address >> 4 & 0xff00);
    return pBVar2;
  }
  return (BVStatic<256UL> *)0x0;
}

Assistant:

BVStatic<BitCount>* HeapBlockMap64::GetMarkBitVectorForPages(void * address)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);
    return node->map.GetMarkBitVectorForPages<BitCount>(address);
}